

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O1

bool __thiscall
node::BlockAssembler::TestPackage
          (BlockAssembler *this,uint64_t packageSize,int64_t packageSigOpsCost)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return packageSize * 4 + this->nBlockWeight < (this->m_options).nBlockMaxWeight &&
           packageSigOpsCost + this->nBlockSigOpsCost < 80000;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockAssembler::TestPackage(uint64_t packageSize, int64_t packageSigOpsCost) const
{
    // TODO: switch to weight-based accounting for packages instead of vsize-based accounting.
    if (nBlockWeight + WITNESS_SCALE_FACTOR * packageSize >= m_options.nBlockMaxWeight) {
        return false;
    }
    if (nBlockSigOpsCost + packageSigOpsCost >= MAX_BLOCK_SIGOPS_COST) {
        return false;
    }
    return true;
}